

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O2

int Saig_SynchCountX(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords,int *piPat)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  void *__ptr;
  void *pvVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar3 = nWords << 4;
  __ptr = calloc((long)(int)uVar3,4);
  uVar10 = (ulong)(uint)nWords;
  iVar7 = 0;
  if (nWords < 1) {
    uVar10 = 0;
    iVar7 = 0;
  }
  for (; iVar7 < pAig->nRegs; iVar7 = iVar7 + 1) {
    pvVar4 = Vec_PtrEntry(pAig->vCos,pAig->nTruePos + iVar7);
    pvVar4 = Vec_PtrEntry(vSimInfo,*(int *)((long)pvVar4 + 0x24));
    for (uVar6 = 0; uVar6 != uVar10; uVar6 = uVar6 + 1) {
      uVar2 = *(uint *)((long)pvVar4 + uVar6 * 4);
      for (lVar5 = 0; lVar5 != 0x20; lVar5 = lVar5 + 2) {
        if ((~(uVar2 >> ((byte)lVar5 & 0x1f)) & 3) == 0) {
          piVar1 = (int *)((long)__ptr + lVar5 * 2 + (ulong)((uint)uVar6 & 0xfffffff) * 0x40);
          *piVar1 = *piVar1 + 1;
        }
      }
    }
  }
  iVar7 = pAig->nRegs + 1;
  uVar6 = 0;
  uVar10 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar10 = uVar6;
  }
  uVar9 = 0xffffffffffffffff;
  do {
    iVar8 = (int)uVar9;
    if (uVar10 == uVar6) {
LAB_005a2569:
      free(__ptr);
      *piPat = iVar8;
      return iVar7;
    }
    iVar8 = *(int *)((long)__ptr + uVar6 * 4);
    if (iVar8 < iVar7) {
      if (iVar8 == 0) {
        iVar7 = 0;
        iVar8 = (int)uVar6;
        goto LAB_005a2569;
      }
      uVar9 = uVar6 & 0xffffffff;
      iVar7 = iVar8;
    }
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

int Saig_SynchCountX( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords, int * piPat )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int * pCounters, i, w, b;
    int iPatBest, iTernMin;
    // count the number of ternary values in each pattern
    pCounters = ABC_CALLOC( int, nWords * 16 );
    Saig_ManForEachLi( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            for ( b = 0; b < 16; b++ )
                if ( ((pSim[w] >> (b << 1)) & 3) == 3 )
                    pCounters[16 * w + b]++;
    }
    // get the best pattern
    iPatBest = -1;
    iTernMin = 1 + Saig_ManRegNum(pAig);
    for ( b = 0; b < 16 * nWords; b++ )
        if ( iTernMin > pCounters[b] )
        {
            iTernMin = pCounters[b];
            iPatBest = b;
            if ( iTernMin == 0 )
                break;
        }
    ABC_FREE( pCounters );
    *piPat = iPatBest;
    return iTernMin;
}